

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut2_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  AssertionResult gtest_ar;
  ConfidentialTransactionController txc;
  uint in_stack_fffffffffffff49c;
  ConfidentialTxInReference *in_stack_fffffffffffff4a0;
  ConfidentialTxOutReference *this_00;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_fffffffffffff4b0;
  AssertHelper local_aa0;
  Message local_a98;
  string local_a90 [32];
  AssertionResult local_a70;
  allocator local_a59;
  string local_a58 [32];
  ConfidentialAssetId local_a38;
  undefined8 local_a10;
  undefined1 local_a08;
  undefined8 local_a00;
  undefined1 local_9f8;
  Amount local_9f0 [248];
  ByteData local_8f8;
  allocator local_8d9;
  ByteData local_8d8;
  Privkey local_8b8;
  undefined1 local_898 [32];
  string local_878 [32];
  Pubkey local_858 [15];
  allocator local_6d9;
  string local_6d8 [32];
  BlockHash local_6b8;
  allocator local_691;
  string local_690 [32];
  ConfidentialAssetId local_670;
  _func_int **local_648;
  undefined1 local_640;
  undefined1 local_638 [271];
  allocator local_529;
  string local_528 [32];
  ConfidentialAssetId local_508;
  undefined8 local_4e0;
  undefined1 local_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8;
  vector local_4c0 [31];
  allocator local_4a1;
  string local_4a0 [32];
  ConfidentialAssetId local_480 [9];
  Address local_308 [271];
  allocator local_1f9;
  string local_1f8 [32];
  Txid local_1d8;
  Txid local_1b8 [11];
  ConfidentialTransactionController local_58;
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_58,2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_1f9
            );
  cfd::core::Txid::Txid(&local_1d8,local_1f8);
  cfd::ConfidentialTransactionController::AddTxIn(local_1b8,(uint)&local_58,(uint)&local_1d8);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffff4a0);
  cfd::core::Txid::~Txid((Txid *)0x1cc6ce);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",&local_4a1);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address((Address *)local_480,local_4a0,local_4c0);
  local_4e0 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_4d8 = extraout_DL;
  local_4d0 = local_4e0;
  local_4c8 = extraout_DL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_528,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_529
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_508,local_528);
  cfd::ConfidentialTransactionController::AddTxOut(local_308,(Amount *)&local_58,local_480);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)in_stack_fffffffffffff4a0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1cc838);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  cfd::core::Address::~Address((Address *)in_stack_fffffffffffff4a0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (in_stack_fffffffffffff4b0);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  local_648 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_640 = extraout_DL_00;
  local_638._0_8_ = local_648;
  local_638[8] = extraout_DL_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_690,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_691
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_670,local_690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6d8,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",&local_6d9
            );
  cfd::core::BlockHash::BlockHash(&local_6b8,local_6d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_878,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",(allocator *)(local_898 + 0x1f));
  cfd::core::Address::Address((Address *)local_858,local_878);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_898);
  cfd::core::Privkey::Privkey(&local_8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d8,"",&local_8d9);
  cfd::core::ByteData::ByteData(&local_8f8);
  this_00 = (ConfidentialTxOutReference *)local_898;
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            ((Amount *)(local_638 + 0x10),(ConfidentialAssetId *)&local_58,(BlockHash *)local_638,
             (Address *)&local_670,(NetType)&local_6b8,local_858,
             (Privkey *)((ulong)in_stack_fffffffffffff49c << 0x20),(string *)this_00,
             (uint)&local_8b8,&local_8d8,kMainnet,(Address *)&local_8f8);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(this_00);
  cfd::core::ByteData::~ByteData((ByteData *)0x1ccab4);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  cfd::core::Privkey::~Privkey((Privkey *)0x1ccadb);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1ccae8);
  cfd::core::Address::~Address((Address *)this_00);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator((allocator<char> *)(local_898 + 0x1f));
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x1ccb1c);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1ccb43);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  local_a10 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_a08 = extraout_DL_01;
  local_a00 = local_a10;
  local_9f8 = extraout_DL_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a58,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_a59
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_a38,local_a58);
  cfd::ConfidentialTransactionController::AddTxOutFee(local_9f0,(ConfidentialAssetId *)&local_58);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(this_00);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1ccc2d);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a59);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a70,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,pcVar2,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string(local_a90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a70);
  if (!bVar1) {
    testing::Message::Message(&local_a98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1cd0d1);
    testing::internal::AssertHelper::AssertHelper
              (&local_aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_aa0,&local_a98);
    testing::internal::AssertHelper::~AssertHelper(&local_aa0);
    testing::Message::~Message((Message *)0x1cd12e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cd183);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_00);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut2)
{
    ConfidentialTransactionController txc(2, 0);
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"));
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");

}